

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint LodePNGUnknownChunks_copy(LodePNGInfo *dest,LodePNGInfo *src)

{
  uchar *puVar1;
  ulong local_30;
  size_t j;
  uint i;
  LodePNGInfo *src_local;
  LodePNGInfo *dest_local;
  
  LodePNGUnknownChunks_cleanup(dest);
  j._4_4_ = 0;
  while( true ) {
    if (j._4_4_ == 3) {
      return 0;
    }
    dest->unknown_chunks_size[j._4_4_] = src->unknown_chunks_size[j._4_4_];
    puVar1 = (uchar *)lodepng_malloc(src->unknown_chunks_size[j._4_4_]);
    dest->unknown_chunks_data[j._4_4_] = puVar1;
    if ((dest->unknown_chunks_data[j._4_4_] == (uchar *)0x0) &&
       (dest->unknown_chunks_size[j._4_4_] != 0)) break;
    for (local_30 = 0; local_30 < src->unknown_chunks_size[j._4_4_]; local_30 = local_30 + 1) {
      dest->unknown_chunks_data[j._4_4_][local_30] = src->unknown_chunks_data[j._4_4_][local_30];
    }
    j._4_4_ = j._4_4_ + 1;
  }
  return 0x53;
}

Assistant:

static unsigned LodePNGUnknownChunks_copy(LodePNGInfo* dest, const LodePNGInfo* src)
{
  unsigned i;

  LodePNGUnknownChunks_cleanup(dest);

  for(i = 0; i != 3; ++i)
  {
    size_t j;
    dest->unknown_chunks_size[i] = src->unknown_chunks_size[i];
    dest->unknown_chunks_data[i] = (unsigned char*)lodepng_malloc(src->unknown_chunks_size[i]);
    if(!dest->unknown_chunks_data[i] && dest->unknown_chunks_size[i]) return 83; /*alloc fail*/
    for(j = 0; j < src->unknown_chunks_size[i]; ++j)
    {
      dest->unknown_chunks_data[i][j] = src->unknown_chunks_data[i][j];
    }
  }

  return 0;
}